

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O3

int SDL_GL_SetAttribute(SDL12_GLattr attr,int value)

{
  int iVar1;
  int iVar2;
  undefined8 in_RDX;
  
  if (SDL12_GL_SWAP_CONTROL < attr) {
    iVar2 = (*SDL20_SetError)("Unknown GL attribute",value,in_RDX,SDL20_SetError);
    return iVar2;
  }
  iVar2 = SwapInterval;
  iVar1 = OpenGLLogicalScalingSamples;
  if (((attr != SDL12_GL_MULTISAMPLEBUFFERS) && (iVar1 = value, attr != SDL12_GL_MULTISAMPLESAMPLES)
      ) && (iVar2 = value, iVar1 = OpenGLLogicalScalingSamples, attr != SDL12_GL_SWAP_CONTROL)) {
    iVar2 = (*SDL20_GL_SetAttribute)(attr,value);
    return iVar2;
  }
  OpenGLLogicalScalingSamples = iVar1;
  SwapInterval = iVar2;
  return 0;
}

Assistant:

SDLCALL
SDL_GL_SetAttribute(SDL12_GLattr attr, int value)
{
    if (attr >= SDL12_GL_MAX_ATTRIBUTE) {
        return SDL20_SetError("Unknown GL attribute");
    }

    /* swap control was moved out of this API, everything else lines up. */
    if (attr == SDL12_GL_SWAP_CONTROL) {
        SwapInterval = value;
        return 0;
    }
    if (attr == SDL12_GL_MULTISAMPLESAMPLES) {
        OpenGLLogicalScalingSamples = value;
        return 0;
    }
    if (attr == SDL12_GL_MULTISAMPLEBUFFERS) {
        return 0;
    }
    return SDL20_GL_SetAttribute((SDL_GLattr) attr, value);
}